

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O2

int uv_fs_poll_stop(uv_fs_poll_t *handle)

{
  uint *puVar1;
  uint uVar2;
  long *plVar3;
  int iVar4;
  char *__assertion;
  
  iVar4 = uv_is_active((uv_handle_t *)handle);
  if (iVar4 == 0) {
    return 0;
  }
  plVar3 = (long *)handle->poll_ctx;
  if (plVar3 == (long *)0x0) {
    __assertion = "ctx != NULL";
    uVar2 = 0x7b;
  }
  else {
    if ((uv_fs_poll_t *)*plVar3 == handle) {
      iVar4 = uv_is_active((uv_handle_t *)(plVar3 + 5));
      if (iVar4 != 0) {
        uv_close((uv_handle_t *)(plVar3 + 5),timer_close_cb);
      }
      uVar2 = handle->flags;
      if ((uVar2 & 4) == 0) {
        return 0;
      }
      handle->flags = uVar2 & 0xfffffffb;
      if ((uVar2 & 8) == 0) {
        return 0;
      }
      puVar1 = &handle->loop->active_handles;
      *puVar1 = *puVar1 - 1;
      return 0;
    }
    __assertion = "ctx->parent_handle == handle";
    uVar2 = 0x7c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/fs-poll.c"
                ,uVar2,"int uv_fs_poll_stop(uv_fs_poll_t *)");
}

Assistant:

int uv_fs_poll_stop(uv_fs_poll_t* handle) {
  struct poll_ctx* ctx;

  if (!uv_is_active((uv_handle_t*)handle))
    return 0;

  ctx = handle->poll_ctx;
  assert(ctx != NULL);
  assert(ctx->parent_handle == handle);

  /* Close the timer if it's active. If it's inactive, there's a stat request
   * in progress and poll_cb will take care of the cleanup.
   */
  if (uv_is_active((uv_handle_t*)&ctx->timer_handle))
    uv_close((uv_handle_t*)&ctx->timer_handle, timer_close_cb);

  uv__handle_stop(handle);

  return 0;
}